

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Value *item)

{
  long lVar1;
  ValueType VVar2;
  CType CVar3;
  uint64_t uVar4;
  int64_t iVar5;
  string *psVar6;
  string_view *psVar7;
  void *pvVar8;
  undefined8 uVar9;
  char *msg;
  Value *in_RSI;
  long in_RDI;
  bool bVar10;
  double dVar11;
  void *value;
  ValueLength size_1;
  char *p_1;
  int64_t v_3;
  string_view *sv;
  string *s;
  size_t size;
  char *p;
  uint64_t v_2;
  int64_t v_1;
  int64_t vv;
  uint64_t x;
  double v;
  CType ctype;
  ValueLength oldPos;
  undefined4 in_stack_fffffffffffffe88;
  ExceptionType in_stack_fffffffffffffe8c;
  uint8_t uVar12;
  Builder *in_stack_fffffffffffffe90;
  ValueLength in_stack_fffffffffffffe98;
  ExceptionType EVar13;
  Builder *in_stack_fffffffffffffea0;
  uint64_t in_stack_fffffffffffffea8;
  Builder *in_stack_fffffffffffffeb0;
  bool local_d1;
  size_t local_88;
  char *local_80;
  ulong local_60;
  char *local_58;
  uint64_t local_40;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  CVar3 = Value::cType(in_RSI);
  VVar2 = Value::valueType(in_RSI);
  if (VVar2 != String) {
    Value::valueType(in_RSI);
  }
  checkKeyHasValidType(in_stack_fffffffffffffeb0,SUB81(in_stack_fffffffffffffea8 >> 0x38,0));
  VVar2 = Value::valueType(in_RSI);
  uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
  switch(VVar2) {
  case None:
    msg = (char *)__cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)in_stack_fffffffffffffea0,
               (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  case Illegal:
    appendByte(in_stack_fffffffffffffe90,uVar12);
    break;
  case Null:
    appendByte(in_stack_fffffffffffffe90,uVar12);
    break;
  case Bool:
    if (CVar3 != Bool) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_fffffffffffffea0,
                 (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                 (char *)in_stack_fffffffffffffe90);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    Value::getBool(in_RSI);
    appendByte(in_stack_fffffffffffffe90,(uint8_t)(in_stack_fffffffffffffe8c >> 0x18));
    break;
  case Array:
    Value::unindexed((Value *)in_stack_fffffffffffffe90);
    addArray(in_stack_fffffffffffffe90,SUB41(in_stack_fffffffffffffe8c >> 0x18,0));
    break;
  case Object:
    Value::unindexed((Value *)in_stack_fffffffffffffe90);
    addObject(in_stack_fffffffffffffe90,SUB41(in_stack_fffffffffffffe8c >> 0x18,0));
    break;
  case Double:
    if (CVar3 == Double) {
      Value::getDouble(in_RSI);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
    }
    else if (CVar3 == Int64) {
      Value::getInt64(in_RSI);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
    }
    else {
      if (CVar3 != UInt64) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      Value::getUInt64(in_RSI);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
    }
    reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    appendByteUnchecked(in_stack_fffffffffffffe90,uVar12);
    appendLengthUnchecked<8ul>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case UTCDate:
    if (CVar3 == Double) {
      Value::getDouble(in_RSI);
    }
    else if (CVar3 == Int64) {
      Value::getInt64(in_RSI);
    }
    else {
      if (CVar3 != UInt64) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      uVar4 = Value::getUInt64(in_RSI);
      toInt64(uVar4);
    }
    addUTCDate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    break;
  case External:
    if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x27) & 1) != 0) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception((Exception *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    if (CVar3 != VoidPtr) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_fffffffffffffea0,
                 (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                 (char *)in_stack_fffffffffffffe90);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    appendByteUnchecked(in_stack_fffffffffffffe90,(uint8_t)(in_stack_fffffffffffffe8c >> 0x18));
    pvVar8 = Value::getExternal(in_RSI);
    *(void **)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)) = pvVar8;
    advance(in_stack_fffffffffffffe90,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
    ;
    break;
  case MinKey:
    appendByte(in_stack_fffffffffffffe90,uVar12);
    break;
  case MaxKey:
    appendByte(in_stack_fffffffffffffe90,uVar12);
    break;
  case Int:
    if (CVar3 == Double) {
      Value::getDouble(in_RSI);
    }
    else if (CVar3 == Int64) {
      Value::getInt64(in_RSI);
    }
    else {
      if (CVar3 != UInt64) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      uVar4 = Value::getUInt64(in_RSI);
      toInt64(uVar4);
    }
    addInt(in_stack_fffffffffffffe90,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    break;
  case UInt:
    if (CVar3 == Double) {
      dVar11 = Value::getDouble(in_RSI);
      EVar13 = (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20);
      if (dVar11 < 0.0) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,EVar13,(char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      Value::getDouble(in_RSI);
    }
    else if (CVar3 == Int64) {
      iVar5 = Value::getInt64(in_RSI);
      EVar13 = (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20);
      if (iVar5 < 0) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,EVar13,(char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      Value::getInt64(in_RSI);
    }
    else {
      if (CVar3 != UInt64) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      Value::getUInt64(in_RSI);
    }
    addUInt(in_stack_fffffffffffffe90,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
    ;
    break;
  case SmallInt:
    if (CVar3 == Double) {
      dVar11 = Value::getDouble(in_RSI);
      EVar13 = (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
      local_40 = (uint64_t)dVar11;
    }
    else if (CVar3 == Int64) {
      local_40 = Value::getInt64(in_RSI);
      EVar13 = (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
    }
    else {
      if (CVar3 != UInt64) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      local_40 = Value::getUInt64(in_RSI);
      EVar13 = (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20);
      uVar12 = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
    }
    local_d1 = (long)local_40 < -6 || 9 < (long)local_40;
    if (local_d1) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_fffffffffffffea0,EVar13,(char *)in_stack_fffffffffffffe90);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    if ((long)local_40 < 0) {
      appendByte(in_stack_fffffffffffffe90,uVar12);
    }
    else {
      appendByte(in_stack_fffffffffffffe90,uVar12);
    }
    break;
  case String:
    if (CVar3 == String) {
      psVar6 = Value::getString_abi_cxx11_(in_RSI);
      local_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(psVar6);
      local_58 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10a1f3)
      ;
    }
    else if (CVar3 == CharPtr) {
      local_58 = Value::getCharPtr(in_RSI);
      local_60 = strlen(local_58);
    }
    else {
      if (CVar3 != StringView) {
        uVar9 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_fffffffffffffea0,
                   (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                   (char *)in_stack_fffffffffffffe90);
        __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
      }
      psVar7 = Value::getStringView(in_RSI);
      local_60 = std::basic_string_view<char,_std::char_traits<char>_>::size(psVar7);
      local_58 = std::basic_string_view<char,_std::char_traits<char>_>::data(psVar7);
    }
    if (local_60 < 0x7f) {
      reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      appendByteUnchecked(in_stack_fffffffffffffe90,(uint8_t)(in_stack_fffffffffffffe8c >> 0x18));
    }
    else {
      reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      appendByteUnchecked(in_stack_fffffffffffffe90,(uint8_t)(in_stack_fffffffffffffe8c >> 0x18));
      appendLengthUnchecked<8ul>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    if (local_60 != 0) {
      memcpy((void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)),local_58,local_60);
      advance(in_stack_fffffffffffffe90,
              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    break;
  case Binary:
    bVar10 = false;
    if ((CVar3 != String) && (bVar10 = false, CVar3 != CharPtr)) {
      bVar10 = CVar3 != StringView;
    }
    if (bVar10) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_fffffffffffffea0,
                 (ExceptionType)(in_stack_fffffffffffffe98 >> 0x20),
                 (char *)in_stack_fffffffffffffe90);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    if (CVar3 == String) {
      Value::getString_abi_cxx11_(in_RSI);
      local_80 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10a53f)
      ;
      psVar6 = Value::getString_abi_cxx11_(in_RSI);
      local_88 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(psVar6);
    }
    else if (CVar3 == StringView) {
      psVar7 = Value::getStringView(in_RSI);
      local_80 = std::basic_string_view<char,_std::char_traits<char>_>::data(psVar7);
      psVar7 = Value::getStringView(in_RSI);
      local_88 = std::basic_string_view<char,_std::char_traits<char>_>::size(psVar7);
    }
    else {
      local_80 = Value::getCharPtr(in_RSI);
      local_88 = strlen(local_80);
    }
    appendUInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (uint8_t)((ulong)in_stack_fffffffffffffea0 >> 0x38));
    if (local_88 != 0) {
      reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      memcpy((void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)),local_80,local_88);
      advance(in_stack_fffffffffffffe90,
              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    break;
  case BCD:
    uVar9 = __cxa_allocate_exception(0x18);
    Exception::Exception((Exception *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x28) & 1) != 0) {
      uVar9 = __cxa_allocate_exception(0x18);
      Exception::Exception((Exception *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
    }
    uVar9 = __cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)in_stack_fffffffffffffea0,(ExceptionType)((ulong)uVar9 >> 0x20),
               (char *)in_stack_fffffffffffffe90);
    __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
  case Tagged:
    uVar9 = __cxa_allocate_exception(0x18);
    Exception::Exception((Exception *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    __cxa_throw(uVar9,&Exception::typeinfo,Exception::~Exception);
  }
  return (uint8_t *)(*(long *)(in_RDI + 0x18) + lVar1);
}

Assistant:

uint8_t* Builder::set(Value const& item) {
  auto const oldPos = _pos;
  auto ctype = item.cType();

  checkKeyHasValidType(item.valueType() == ValueType::String ||
                       item.valueType() == ValueType::UInt);

  // This method builds a single further VPack item at the current
  // append position. If this is an array or object, then an index
  // table is created and a new ValueLength is pushed onto the stack.
  switch (item.valueType()) {
    case ValueType::Null: {
      appendByte(0x18);
      break;
    }
    case ValueType::Bool: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::Bool)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give bool for ValueType::Bool");
      }
      appendByte(item.getBool() ? 0x1a : 0x19);
      break;
    }
    case ValueType::Double: {
      static_assert(sizeof(double) == sizeof(uint64_t),
                    "size of double is not 8 bytes");
      double v = 0.0;
      uint64_t x;
      switch (ctype) {
        case Value::CType::Double:
          v = item.getDouble();
          break;
        case Value::CType::Int64:
          v = static_cast<double>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = static_cast<double>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Double");
      }
      reserve(1 + sizeof(double));
      appendByteUnchecked(0x1b);
      std::memcpy(&x, &v, sizeof(double));
      appendLengthUnchecked<sizeof(double)>(x);
      break;
    }
    case ValueType::SmallInt: {
      int64_t vv = 0;
      switch (ctype) {
        case Value::CType::Double:
          vv = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          vv = item.getInt64();
          break;
        case Value::CType::UInt64:
          vv = static_cast<int64_t>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::SmallInt");
      }
      if (VELOCYPACK_UNLIKELY(vv < -6 || vv > 9)) {
        throw Exception(Exception::NumberOutOfRange,
                        "Number out of range of ValueType::SmallInt");
      }
      if (vv >= 0) {
        appendByte(static_cast<uint8_t>(vv + 0x30));
      } else {
        appendByte(static_cast<uint8_t>(vv + 0x40));
      }
      break;
    }
    case ValueType::Int: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Int");
      }
      addInt(v);
      break;
    }
    case ValueType::UInt: {
      uint64_t v = 0;
      switch (ctype) {
        case Value::CType::Double:
          if (VELOCYPACK_UNLIKELY(item.getDouble() < 0.0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          if (VELOCYPACK_UNLIKELY(item.getInt64() < 0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = item.getUInt64();
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UInt");
      }
      addUInt(v);
      break;
    }
    case ValueType::String: {
      char const* p;
      std::size_t size;
      if (ctype == Value::CType::String) {
        std::string const* s = item.getString();
        size = s->size();
        p = s->data();
      } else if (ctype == Value::CType::CharPtr) {
        p = item.getCharPtr();
        size = strlen(p);
      } else if (ctype == Value::CType::StringView) {
        std::string_view const* sv = item.getStringView();
        size = sv->size();
        p = sv->data();
      } else {
        throw Exception(
            Exception::BuilderUnexpectedValue,
            "Must give a string or char const* for ValueType::String");
      }
      if (size <= 126) {
        // short string
        reserve(1 + size);
        appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
      } else {
        // long string
        reserve(1 + 8 + size);
        appendByteUnchecked(0xbf);
        appendLengthUnchecked<8>(size);
      }
      if (size != 0) {
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, size);
        advance(size);
      }
      break;
    }
    case ValueType::Array: {
      addArray(item.unindexed());
      break;
    }
    case ValueType::Object: {
      addObject(item.unindexed());
      break;
    }
    case ValueType::UTCDate: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UTCDate");
      }
      addUTCDate(v);
      break;
    }
    case ValueType::Binary: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::String &&
                              ctype != Value::CType::CharPtr &&
                              ctype != Value::CType::StringView)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must provide std::string, std::string_view or char "
                        "const* for ValueType::Binary");
      }
      char const* p;
      ValueLength size;
      if (ctype == Value::CType::String) {
        p = item.getString()->data();
        size = item.getString()->size();
      } else if (ctype == Value::CType::StringView) {
        p = item.getStringView()->data();
        size = item.getStringView()->size();
      } else {
        p = item.getCharPtr();
        size = strlen(p);
      }
      appendUInt(size, 0xbf);
      if (size != 0) {
        reserve(size);
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, checkOverflow(size));
        advance(size);
      }
      break;
    }
    case ValueType::External: {
      if (options->disallowExternals) {
        // External values explicitly disallowed as a security
        // precaution
        throw Exception(Exception::BuilderExternalsDisallowed);
      }
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::VoidPtr)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give void pointer for ValueType::External");
      }
      reserve(1 + sizeof(void*));
      // store pointer. this doesn't need to be portable
      appendByteUnchecked(0x1d);
      void const* value = item.getExternal();
      std::memcpy(_start + _pos, &value, sizeof(void*));
      advance(sizeof(void*));
      break;
    }
    case ValueType::Illegal: {
      appendByte(0x17);
      break;
    }
    case ValueType::MinKey: {
      appendByte(0x1e);
      break;
    }
    case ValueType::MaxKey: {
      appendByte(0x1f);
      break;
    }
    case ValueType::BCD: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Tagged: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Custom: {
      if (options->disallowCustom) {
        // Custom values explicitly disallowed as a security precaution
        throw Exception(Exception::BuilderCustomDisallowed);
      }
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::Custom with this method");
    }
    case ValueType::None: {
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::None");
    }
  }
  return _start + oldPos;
}